

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

void __thiscall cnn::SimpleRNNBuilder::new_graph_impl(SimpleRNNBuilder *this,ComputationGraph *cg)

{
  reference pvVar1;
  reference ppPVar2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_RDI;
  Expression i_l2h;
  Parameters *p_l2h;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> vars;
  Expression i_hb;
  Expression i_h2h;
  Expression i_x2h;
  Parameters *p_hb;
  Parameters *p_h2h;
  Parameters *p_x2h;
  uint i;
  Expression *in_stack_fffffffffffffed8;
  Expression *this_00;
  value_type *__x;
  Parameters *in_stack_fffffffffffffef0;
  ComputationGraph *in_stack_fffffffffffffef8;
  allocator_type *__a;
  initializer_list<cnn::expr::Expression> in_stack_ffffffffffffff18;
  allocator_type local_b9;
  undefined1 local_b8 [48];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_60 [32];
  value_type local_40;
  value_type local_30;
  value_type local_28;
  value_type local_20;
  uint local_14;
  
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
           *)0x66d98d);
  for (local_14 = 0;
      local_14 <
      *(uint *)&in_RDI[5].
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage; local_14 = local_14 + 1) {
    this_00 = (Expression *)
              &in_RDI[1].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar1 = std::
             vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
             ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                           *)this_00,(ulong)local_14);
    ppPVar2 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                        (pvVar1,0);
    local_20 = *ppPVar2;
    pvVar1 = std::
             vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
             ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                           *)this_00,(ulong)local_14);
    ppPVar2 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                        (pvVar1,1);
    local_28 = *ppPVar2;
    pvVar1 = std::
             vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
             ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                           *)this_00,(ulong)local_14);
    ppPVar2 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                        (pvVar1,2);
    local_30 = *ppPVar2;
    __x = &local_40;
    expr::parameter(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef0 = (Parameters *)(local_60 + 0x10);
    expr::parameter(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef8 = (ComputationGraph *)local_60;
    expr::parameter(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    expr::Expression::Expression(this_00,in_stack_fffffffffffffed8);
    expr::Expression::Expression(this_00,in_stack_fffffffffffffed8);
    expr::Expression::Expression(this_00,in_stack_fffffffffffffed8);
    local_80 = 3;
    __a = &local_b9;
    local_88 = local_b8;
    std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x66daff);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
              (in_RDI,in_stack_ffffffffffffff18,__a);
    std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x66db2d);
    if (((ulong)in_RDI[5].
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100000000) != 0) {
      pvVar1 = std::
               vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                             *)&in_RDI[1].
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_14);
      std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[](pvVar1,3);
      expr::parameter(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_fffffffffffffef0,__x);
    }
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 *)in_stack_fffffffffffffef0,(value_type *)__x);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void SimpleRNNBuilder::new_graph_impl(ComputationGraph& cg) {
  param_vars.clear();
  for (unsigned i = 0; i < layers; ++i) {
    Parameters* p_x2h = params[i][X2H];
    Parameters* p_h2h = params[i][H2H];
    Parameters* p_hb = params[i][HB];
    Expression i_x2h =  parameter(cg,p_x2h);
    Expression i_h2h =  parameter(cg,p_h2h);
    Expression i_hb =  parameter(cg,p_hb);
    vector<Expression> vars = {i_x2h, i_h2h, i_hb};

    if (lagging) {
        Parameters* p_l2h = params[i][L2H];
        Expression i_l2h =  parameter(cg,p_l2h);
        vars.push_back(i_l2h);
    }

    param_vars.push_back(vars);
  }
}